

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttgxvar.c
# Opt level: O0

FT_Error tt_var_load_item_variation_store(TT_Face face,FT_ULong offset,GX_ItemVarStore itemStore)

{
  GX_Blend pGVar1;
  long lVar2;
  FT_Byte FVar3;
  FT_UInt16 FVar4;
  FT_UInt16 FVar5;
  FT_UInt16 FVar6;
  FT_UInt16 FVar7;
  FT_UInt32 FVar8;
  uint uVar9;
  FT_UInt32 FVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  FT_Pointer pvVar14;
  uint *puVar15;
  FT_UInt region_idx_count;
  FT_UInt word_delta_count;
  FT_UInt item_count;
  GX_ItemVarData varData;
  FT_Short end;
  FT_Short peak;
  FT_Short start;
  GX_AxisCoords axisCoords;
  FT_ULong *dataOffsetArray;
  GX_Blend blend;
  uint local_58;
  uint uStack_54;
  FT_Bool long_words;
  FT_UInt k;
  FT_UInt j;
  FT_UInt i;
  FT_UInt region_count;
  FT_UShort axis_count;
  FT_UInt data_count;
  FT_ULong region_offset;
  FT_UShort format;
  FT_Memory pFStack_30;
  FT_Error error;
  FT_Memory memory;
  FT_Stream stream;
  GX_ItemVarStore itemStore_local;
  FT_ULong offset_local;
  TT_Face face_local;
  
  memory = (FT_Memory)(face->root).stream;
  pFStack_30 = ((FT_Stream)memory)->memory;
  pGVar1 = face->blend;
  axisCoords = (GX_AxisCoords)0x0;
  stream = (FT_Stream)itemStore;
  itemStore_local = (GX_ItemVarStore)offset;
  offset_local = (FT_ULong)face;
  region_offset._4_4_ = FT_Stream_Seek((FT_Stream)memory,offset);
  if ((region_offset._4_4_ == 0) &&
     (region_offset._2_2_ =
           FT_Stream_ReadUShort((FT_Stream)memory,(FT_Error *)((long)&region_offset + 4)),
     region_offset._4_4_ == 0)) {
    if (region_offset._2_2_ == 1) {
      FVar8 = FT_Stream_ReadULong((FT_Stream)memory,(FT_Error *)((long)&region_offset + 4));
      if (region_offset._4_4_ == 0) {
        FVar4 = FT_Stream_ReadUShort((FT_Stream)memory,(FT_Error *)((long)&region_offset + 4));
        uVar9 = (uint)FVar4;
        if (region_offset._4_4_ == 0) {
          if (uVar9 == 0) {
            region_offset._4_4_ = 8;
          }
          else {
            axisCoords = (GX_AxisCoords)
                         ft_mem_qrealloc(pFStack_30,8,0,(ulong)uVar9,(void *)0x0,
                                         (FT_Error *)((long)&region_offset + 4));
            if (region_offset._4_4_ == 0) {
              for (k = 0; k < uVar9; k = k + 1) {
                FVar10 = FT_Stream_ReadULong((FT_Stream)memory,
                                             (FT_Error *)((long)&region_offset + 4));
                (&axisCoords->startCoord)[k] = (ulong)FVar10;
                if (region_offset._4_4_ != 0) goto LAB_0034a974;
              }
              region_offset._4_4_ =
                   FT_Stream_Seek((FT_Stream)memory,(long)&itemStore_local->dataCount + (ulong)FVar8
                                 );
              if ((region_offset._4_4_ == 0) &&
                 (FVar4 = FT_Stream_ReadUShort
                                    ((FT_Stream)memory,(FT_Error *)((long)&region_offset + 4)),
                 region_offset._4_4_ == 0)) {
                FVar5 = FT_Stream_ReadUShort
                                  ((FT_Stream)memory,(FT_Error *)((long)&region_offset + 4));
                uVar11 = (uint)FVar5;
                if (region_offset._4_4_ == 0) {
                  if ((uint)FVar4 == pGVar1->mmvar->num_axis) {
                    *(FT_UInt16 *)&stream->pos = FVar4;
                    if (uVar11 < 0x8000) {
                      pvVar14 = ft_mem_realloc(pFStack_30,8,0,(ulong)uVar11,(void *)0x0,
                                               (FT_Error *)((long)&region_offset + 4));
                      (stream->descriptor).pointer = pvVar14;
                      if (region_offset._4_4_ == 0) {
                        *(uint *)((long)&stream->pos + 4) = uVar11;
                        for (k = 0; k < *(uint *)((long)&stream->pos + 4); k = k + 1) {
                          pvVar14 = ft_mem_realloc(pFStack_30,0x18,0,(ulong)FVar4,(void *)0x0,
                                                   (FT_Error *)((long)&region_offset + 4));
                          *(FT_Pointer *)((long)(stream->descriptor).pointer + (ulong)k * 8) =
                               pvVar14;
                          if (region_offset._4_4_ != 0) goto LAB_0034a974;
                          lVar2 = *(long *)((long)(stream->descriptor).pointer + (ulong)k * 8);
                          for (uStack_54 = 0; uStack_54 < (ushort)stream->pos;
                              uStack_54 = uStack_54 + 1) {
                            FVar5 = FT_Stream_ReadUShort
                                              ((FT_Stream)memory,
                                               (FT_Error *)((long)&region_offset + 4));
                            if (((region_offset._4_4_ != 0) ||
                                (FVar6 = FT_Stream_ReadUShort
                                                   ((FT_Stream)memory,
                                                    (FT_Error *)((long)&region_offset + 4)),
                                region_offset._4_4_ != 0)) ||
                               (FVar7 = FT_Stream_ReadUShort
                                                  ((FT_Stream)memory,
                                                   (FT_Error *)((long)&region_offset + 4)),
                               region_offset._4_4_ != 0)) goto LAB_0034a974;
                            *(long *)(lVar2 + (ulong)uStack_54 * 0x18) = (long)(short)FVar5 << 2;
                            *(long *)(lVar2 + (ulong)uStack_54 * 0x18 + 8) = (long)(short)FVar6 << 2
                            ;
                            *(long *)(lVar2 + (ulong)uStack_54 * 0x18 + 0x10) =
                                 (long)(short)FVar7 << 2;
                          }
                        }
                        pvVar14 = ft_mem_realloc(pFStack_30,0x18,0,(ulong)uVar9,(void *)0x0,
                                                 (FT_Error *)((long)&region_offset + 4));
                        stream->size = (unsigned_long)pvVar14;
                        if (region_offset._4_4_ == 0) {
                          *(uint *)&stream->base = uVar9;
                          for (k = 0; k < uVar9; k = k + 1) {
                            puVar15 = (uint *)(stream->size + (ulong)k * 0x18);
                            region_offset._4_4_ =
                                 FT_Stream_Seek((FT_Stream)memory,
                                                (long)&itemStore_local->dataCount +
                                                (&axisCoords->startCoord)[k]);
                            if (region_offset._4_4_ != 0) break;
                            FVar4 = FT_Stream_ReadUShort
                                              ((FT_Stream)memory,
                                               (FT_Error *)((long)&region_offset + 4));
                            uVar11 = (uint)FVar4;
                            if (region_offset._4_4_ != 0) break;
                            FVar4 = FT_Stream_ReadUShort
                                              ((FT_Stream)memory,
                                               (FT_Error *)((long)&region_offset + 4));
                            if (region_offset._4_4_ != 0) break;
                            FVar5 = FT_Stream_ReadUShort
                                              ((FT_Stream)memory,
                                               (FT_Error *)((long)&region_offset + 4));
                            uVar12 = (uint)FVar5;
                            if (region_offset._4_4_ != 0) break;
                            uVar13 = FVar4 & 0x7fff;
                            if (uVar12 < uVar13) {
                              region_offset._4_4_ = 8;
                              break;
                            }
                            if (*(uint *)((long)&stream->pos + 4) < uVar12) {
                              region_offset._4_4_ = 8;
                              break;
                            }
                            pvVar14 = ft_mem_realloc(pFStack_30,4,0,(ulong)uVar12,(void *)0x0,
                                                     (FT_Error *)((long)&region_offset + 4));
                            *(FT_Pointer *)(puVar15 + 2) = pvVar14;
                            if (region_offset._4_4_ != 0) break;
                            puVar15[1] = uVar12;
                            for (uStack_54 = 0; uStack_54 < puVar15[1]; uStack_54 = uStack_54 + 1) {
                              FVar5 = FT_Stream_ReadUShort
                                                ((FT_Stream)memory,
                                                 (FT_Error *)((long)&region_offset + 4));
                              *(uint *)(*(long *)(puVar15 + 2) + (ulong)uStack_54 * 4) = (uint)FVar5
                              ;
                              if (region_offset._4_4_ != 0) goto LAB_0034a974;
                              if (*(uint *)((long)&stream->pos + 4) <=
                                  *(uint *)(*(long *)(puVar15 + 2) + (ulong)uStack_54 * 4)) {
                                region_offset._4_4_ = 8;
                                goto LAB_0034a974;
                              }
                            }
                            pvVar14 = ft_mem_realloc(pFStack_30,4,0,(ulong)(uVar11 * uVar12),
                                                     (void *)0x0,
                                                     (FT_Error *)((long)&region_offset + 4));
                            *(FT_Pointer *)(puVar15 + 4) = pvVar14;
                            if (region_offset._4_4_ != 0) break;
                            *puVar15 = uVar11;
                            uStack_54 = 0;
                            while (uStack_54 < uVar11 * uVar12) {
                              if ((FVar4 & 0x8000) == 0) {
                                for (local_58 = 0; local_58 < uVar13; local_58 = local_58 + 1) {
                                  FVar5 = FT_Stream_ReadUShort
                                                    ((FT_Stream)memory,
                                                     (FT_Error *)((long)&region_offset + 4));
                                  *(int *)(*(long *)(puVar15 + 4) + (ulong)uStack_54 * 4) =
                                       (int)(short)FVar5;
                                  if (region_offset._4_4_ != 0) goto LAB_0034a974;
                                  uStack_54 = uStack_54 + 1;
                                }
                                for (; local_58 < uVar12; local_58 = local_58 + 1) {
                                  FVar3 = FT_Stream_ReadByte((FT_Stream)memory,
                                                             (FT_Error *)((long)&region_offset + 4))
                                  ;
                                  *(int *)(*(long *)(puVar15 + 4) + (ulong)uStack_54 * 4) =
                                       (int)(char)FVar3;
                                  if (region_offset._4_4_ != 0) goto LAB_0034a974;
                                  uStack_54 = uStack_54 + 1;
                                }
                              }
                              else {
                                for (local_58 = 0; local_58 < uVar13; local_58 = local_58 + 1) {
                                  FVar8 = FT_Stream_ReadULong((FT_Stream)memory,
                                                              (FT_Error *)((long)&region_offset + 4)
                                                             );
                                  *(FT_UInt32 *)(*(long *)(puVar15 + 4) + (ulong)uStack_54 * 4) =
                                       FVar8;
                                  if (region_offset._4_4_ != 0) goto LAB_0034a974;
                                  uStack_54 = uStack_54 + 1;
                                }
                                for (; local_58 < uVar12; local_58 = local_58 + 1) {
                                  FVar5 = FT_Stream_ReadUShort
                                                    ((FT_Stream)memory,
                                                     (FT_Error *)((long)&region_offset + 4));
                                  *(int *)(*(long *)(puVar15 + 4) + (ulong)uStack_54 * 4) =
                                       (int)(short)FVar5;
                                  if (region_offset._4_4_ != 0) goto LAB_0034a974;
                                  uStack_54 = uStack_54 + 1;
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                    else {
                      region_offset._4_4_ = 8;
                    }
                  }
                  else {
                    region_offset._4_4_ = 8;
                  }
                }
              }
            }
          }
        }
      }
    }
    else {
      region_offset._4_4_ = 8;
    }
  }
LAB_0034a974:
  ft_mem_free(pFStack_30,axisCoords);
  return region_offset._4_4_;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  tt_var_load_item_variation_store( TT_Face          face,
                                    FT_ULong         offset,
                                    GX_ItemVarStore  itemStore )
  {
    FT_Stream  stream = FT_FACE_STREAM( face );
    FT_Memory  memory = stream->memory;

    FT_Error   error;
    FT_UShort  format;
    FT_ULong   region_offset;

    FT_UInt    data_count;
    FT_UShort  axis_count;
    FT_UInt    region_count;

    FT_UInt  i, j, k;
    FT_Bool  long_words;

    GX_Blend   blend           = face->blend;
    FT_ULong*  dataOffsetArray = NULL;


    if ( FT_STREAM_SEEK( offset ) ||
         FT_READ_USHORT( format ) )
      goto Exit;

    if ( format != 1 )
    {
      FT_TRACE2(( "tt_var_load_item_variation_store: bad store format %d\n",
                  format ));
      error = FT_THROW( Invalid_Table );
      goto Exit;
    }

    /* read top level fields */
    if ( FT_READ_ULONG( region_offset ) ||
         FT_READ_USHORT( data_count )   )
      goto Exit;

    /* we need at least one entry in `itemStore->varData' */
    if ( !data_count )
    {
      FT_TRACE2(( "tt_var_load_item_variation_store: missing varData\n" ));
      error = FT_THROW( Invalid_Table );
      goto Exit;
    }

    /* make temporary copy of item variation data offsets; */
    /* we will parse region list first, then come back     */
    if ( FT_QNEW_ARRAY( dataOffsetArray, data_count ) )
      goto Exit;

    for ( i = 0; i < data_count; i++ )
    {
      if ( FT_READ_ULONG( dataOffsetArray[i] ) )
        goto Exit;
    }

    /* parse array of region records (region list) */
    if ( FT_STREAM_SEEK( offset + region_offset ) )
      goto Exit;

    if ( FT_READ_USHORT( axis_count )   ||
         FT_READ_USHORT( region_count ) )
      goto Exit;

    if ( axis_count != (FT_Long)blend->mmvar->num_axis )
    {
      FT_TRACE2(( "tt_var_load_item_variation_store:"
                  " number of axes in item variation store\n" ));
      FT_TRACE2(( "                                 "
                  " and `fvar' table are different\n" ));
      error = FT_THROW( Invalid_Table );
      goto Exit;
    }
    itemStore->axisCount = axis_count;

    /* new constraint in OpenType 1.8.4 */
    if ( region_count >= 32768U )
    {
      FT_TRACE2(( "tt_var_load_item_variation_store:"
                  " too many variation region tables\n" ));
      error = FT_THROW( Invalid_Table );
      goto Exit;
    }

    if ( FT_NEW_ARRAY( itemStore->varRegionList, region_count ) )
      goto Exit;
    itemStore->regionCount = region_count;

    for ( i = 0; i < itemStore->regionCount; i++ )
    {
      GX_AxisCoords  axisCoords;


      if ( FT_NEW_ARRAY( itemStore->varRegionList[i].axisList, axis_count ) )
        goto Exit;

      axisCoords = itemStore->varRegionList[i].axisList;

      for ( j = 0; j < itemStore->axisCount; j++ )
      {
        FT_Short  start, peak, end;


        if ( FT_READ_SHORT( start ) ||
             FT_READ_SHORT( peak )  ||
             FT_READ_SHORT( end )   )
          goto Exit;

        axisCoords[j].startCoord = FT_fdot14ToFixed( start );
        axisCoords[j].peakCoord  = FT_fdot14ToFixed( peak );
        axisCoords[j].endCoord   = FT_fdot14ToFixed( end );
      }
    }

    /* end of region list parse */

    /* use dataOffsetArray now to parse varData items */
    if ( FT_NEW_ARRAY( itemStore->varData, data_count ) )
      goto Exit;
    itemStore->dataCount = data_count;

    for ( i = 0; i < data_count; i++ )
    {
      GX_ItemVarData  varData = &itemStore->varData[i];

      FT_UInt  item_count;
      FT_UInt  word_delta_count;
      FT_UInt  region_idx_count;


      if ( FT_STREAM_SEEK( offset + dataOffsetArray[i] ) )
        goto Exit;

      if ( FT_READ_USHORT( item_count )       ||
           FT_READ_USHORT( word_delta_count ) ||
           FT_READ_USHORT( region_idx_count ) )
        goto Exit;

      long_words        = !!( word_delta_count & 0x8000 );
      word_delta_count &= 0x7FFF;

      /* check some data consistency */
      if ( word_delta_count > region_idx_count )
      {
        FT_TRACE2(( "bad short count %d or region count %d\n",
                    word_delta_count,
                    region_idx_count ));
        error = FT_THROW( Invalid_Table );
        goto Exit;
      }

      if ( region_idx_count > itemStore->regionCount )
      {
        FT_TRACE2(( "inconsistent regionCount %d in varData[%d]\n",
                    region_idx_count,
                    i ));
        error = FT_THROW( Invalid_Table );
        goto Exit;
      }

      /* parse region indices */
      if ( FT_NEW_ARRAY( varData->regionIndices, region_idx_count ) )
        goto Exit;
      varData->regionIdxCount = region_idx_count;

      for ( j = 0; j < varData->regionIdxCount; j++ )
      {
        if ( FT_READ_USHORT( varData->regionIndices[j] ) )
          goto Exit;

        if ( varData->regionIndices[j] >= itemStore->regionCount )
        {
          FT_TRACE2(( "bad region index %d\n",
                      varData->regionIndices[j] ));
          error = FT_THROW( Invalid_Table );
          goto Exit;
        }
      }

      /* Parse delta set.                                                  */
      /*                                                                   */
      /* On input, deltas are (word_delta_count + region_idx_count) bytes  */
      /* each if `long_words` isn't set, and twice as much otherwise.      */
      /*                                                                   */
      /* On output, deltas are expanded to `region_idx_count` shorts each. */
      if ( FT_NEW_ARRAY( varData->deltaSet, item_count * region_idx_count ) )
        goto Exit;
      varData->itemCount = item_count;

      for ( j = 0; j < item_count * region_idx_count; )
      {
        if ( long_words )
        {
          for ( k = 0; k < word_delta_count; k++, j++ )
            if ( FT_READ_LONG( varData->deltaSet[j] ) )
              goto Exit;
          for ( ; k < region_idx_count; k++, j++ )
            if ( FT_READ_SHORT( varData->deltaSet[j] ) )
              goto Exit;
        }
        else
        {
          for ( k = 0; k < word_delta_count; k++, j++ )
            if ( FT_READ_SHORT( varData->deltaSet[j] ) )
              goto Exit;
          for ( ; k < region_idx_count; k++, j++ )
            if ( FT_READ_CHAR( varData->deltaSet[j] ) )
              goto Exit;
        }
      }
    }

  Exit:
    FT_FREE( dataOffsetArray );

    return error;
  }